

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

iterator * __thiscall
ghc::filesystem::path::iterator::operator--
          (iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  int param_1_local;
  iterator *this_local;
  iterator *i;
  
  iterator(__return_storage_ptr__,this);
  operator--(this);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path::iterator path::iterator::operator--(int)
{
    auto i = *this;
    --(*this);
    return i;
}